

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O2

Error __thiscall asmjit::CodeHolder::flatten(CodeHolder *this)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  pvVar1 = (this->_sectionsByOrder).super_ZoneVectorBase._data;
  lVar3 = (ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size << 3;
  lVar4 = 0;
  uVar8 = 0;
  do {
    if (lVar3 == lVar4) {
      uVar8 = 0;
      lVar4 = 0;
      for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 8) {
        lVar2 = *(long *)((long)pvVar1 + lVar5);
        uVar6 = *(ulong *)(lVar2 + 0x50);
        if (*(ulong *)(lVar2 + 0x50) < *(ulong *)(lVar2 + 0x18)) {
          uVar6 = *(ulong *)(lVar2 + 0x18);
        }
        if (uVar6 != 0) {
          uVar8 = -(ulong)*(uint *)(lVar2 + 8) & (uVar8 + *(uint *)(lVar2 + 8)) - 1;
        }
        *(ulong *)(lVar2 + 0x10) = uVar8;
        if (lVar4 != 0) {
          *(ulong *)(lVar4 + 0x18) = uVar8 - *(long *)(lVar4 + 0x10);
        }
        uVar8 = uVar8 + uVar6;
        lVar4 = lVar2;
      }
      return 0;
    }
    lVar5 = *(long *)((long)pvVar1 + lVar4);
    uVar6 = *(ulong *)(lVar5 + 0x50);
    if (*(ulong *)(lVar5 + 0x50) < *(ulong *)(lVar5 + 0x18)) {
      uVar6 = *(ulong *)(lVar5 + 0x18);
    }
    if (uVar6 != 0) {
      uVar7 = -(ulong)*(uint *)(lVar5 + 8) & (uVar8 + *(uint *)(lVar5 + 8)) - 1;
      if (uVar7 < uVar8) {
        return 9;
      }
      uVar8 = uVar7 + uVar6;
      if (CARRY8(uVar7,uVar6)) {
        return 9;
      }
    }
    lVar4 = lVar4 + 8;
  } while( true );
}

Assistant:

inline T* data() noexcept { return static_cast<T*>(_data); }